

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

int __thiscall
cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,cmCPackComponentGroup *group)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  cmCPackIFWGenerator *pcVar2;
  cmCPackLog *pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  long *plVar6;
  mapped_type *pmVar7;
  cmValue cVar8;
  ostream *poVar9;
  size_t sVar10;
  size_type *psVar11;
  string_view arg;
  string_view arg_00;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (group == (cmCPackComponentGroup *)0x0) {
    iVar5 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1c8,&group->Name);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x6df15f);
    pcVar1 = local_1a8 + 0x10;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar11) {
      local_1a8._16_8_ = *psVar11;
      local_1a8._24_8_ = plVar6[3];
      local_1a8._0_8_ = pcVar1;
    }
    else {
      local_1a8._16_8_ = *psVar11;
      local_1a8._0_8_ = (size_type *)*plVar6;
    }
    local_1a8._8_8_ = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_1a8);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1e8.field_2._M_allocated_capacity = *psVar11;
      local_1e8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar11;
      local_1e8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1e8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,(key_type *)local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,(key_type *)local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    cVar8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (cVar8.Value == (string *)0x0) {
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_PACKAGE_VERSION","");
      cVar8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (cVar8.Value == (string *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&this->Version,0,(char *)(this->Version)._M_string_length,0x6df345);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this->Version);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->Version);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    cVar8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (cVar8.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->Script);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    cVar8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (cVar8.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->UserInterfaces,
                        (this->UserInterfaces).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      arg._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar8.Value)->_M_string_length;
      cmExpandList(arg,&this->UserInterfaces,false);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    cVar8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (cVar8.Value != (string *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this_00,(this->Licenses).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      arg_00._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar8.Value)->_M_string_length;
      cmExpandList(arg_00,this_00,false);
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                            local_1e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"LICENSES",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9," should contain pairs of <display_name> and <file_path>.",0x38);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar2 = (this->super_cmCPackIFWCommon).Generator;
        if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
          pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var4._M_p = local_1c8._M_dataplus._M_p;
          sVar10 = strlen(local_1c8._M_dataplus._M_p);
          cmCPackLog::Log(pcVar3,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x141,_Var4._M_p,sVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(this_00,(this_00->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    cVar8 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (cVar8.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->SortingPriority);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The \"PRIORITY\" option is set ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"for component group \"",0x15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(group->Name)._M_dataplus._M_p,
                          (group->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\", but there option is ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"deprecated. Please use \"SORTING_PRIORITY\" option instead.",0x39);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar2 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
        pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var4._M_p = local_1c8._M_dataplus._M_p;
        sVar10 = strlen(local_1c8._M_dataplus._M_p);
        cmCPackLog::Log(pcVar3,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0x14f,_Var4._M_p,sVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    ConfigureFromPrefix(this,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromGroup(cmCPackComponentGroup* group)
{
  if (!group) {
    return 0;
  }

  // Restore default configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_GROUP_" +
    cmsys::SystemTools::UpperCase(group->Name) + "_";

  this->DisplayName[""] = group->DisplayName;
  this->Description[""] = group->Description;

  // Version
  if (cmValue optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = *optVERSION;
  } else if (cmValue optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = *optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (cmValue option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = *option;
  }

  // User interfaces
  if (cmValue option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmExpandList(option, this->UserInterfaces);
  }

  // Licenses
  if (cmValue option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmExpandList(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (cmValue option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = *option;
    cmCPackIFWLogger(
      WARNING,
      "The \"PRIORITY\" option is set "
        << "for component group \"" << group->Name
        << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  return this->ConfigureFromPrefix(prefix);
}